

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

char * testing::internal::GetAnsiColorCode(GTestColor color)

{
  GTestColor color_local;
  char *local_8;
  
  if (color == kRed) {
    local_8 = "1";
  }
  else if (color == kGreen) {
    local_8 = "2";
  }
  else if (color == kYellow) {
    local_8 = "3";
  }
  else {
    local_8 = "9";
  }
  return local_8;
}

Assistant:

static const char* GetAnsiColorCode(GTestColor color) {
  switch (color) {
    case GTestColor::kRed:
      return "1";
    case GTestColor::kGreen:
      return "2";
    case GTestColor::kYellow:
      return "3";
    default:
      assert(false);
      return "9";
  }
}